

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O0

void __thiscall cfd::core::BlockHash::BlockHash(BlockHash *this,BlockHash *object)

{
  BlockHash *object_local;
  BlockHash *this_local;
  
  this->_vptr_BlockHash = (_func_int **)&PTR__BlockHash_0087dd88;
  ByteData::ByteData(&this->data_);
  ByteData::operator=(&this->data_,&object->data_);
  return;
}

Assistant:

BlockHash::BlockHash(const BlockHash& object) { data_ = object.data_; }